

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JustInTime.hpp
# Opt level: O2

unique_ptr<const_Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
 __thiscall
JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::operator->
          (JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1> *this)

{
  __atomic_flag_data_type _Var1;
  _Head_base<0UL,_const_Atari::ST::Video_*,_false> extraout_RDX;
  JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1> *in_RSI;
  unique_ptr<const_Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  uVar2;
  
  LOCK();
  _Var1 = (in_RSI->flush_concurrency_check_).super___atomic_flag_base._M_i;
  (in_RSI->flush_concurrency_check_).super___atomic_flag_base._M_i = true;
  UNLOCK();
  if (_Var1 == false) {
    flush(in_RSI);
    LOCK();
    (in_RSI->flush_concurrency_check_).super___atomic_flag_base._M_i = false;
    UNLOCK();
    (this->super_Observer)._vptr_Observer = (_func_int **)in_RSI;
    (this->object_).deferrer_.pending_actions_.
    super__Vector_base<DeferredQueue<HalfCycles>::DeferredAction,_std::allocator<DeferredQueue<HalfCycles>::DeferredAction>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&in_RSI->object_;
    uVar2._M_t.
    super___uniq_ptr_impl<const_Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_const_Atari::ST::Video_*,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    .super__Head_base<0UL,_const_Atari::ST::Video_*,_false>._M_head_impl = extraout_RDX._M_head_impl
    ;
    uVar2._M_t.
    super___uniq_ptr_impl<const_Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_const_Atari::ST::Video_*,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    .
    super__Tuple_impl<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    .
    super__Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
    ._M_head_impl.actor_ =
         (_Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
          )(_Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
            )this;
    return (unique_ptr<const_Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
            )uVar2._M_t.
             super___uniq_ptr_impl<const_Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
             ._M_t.
             super__Tuple_impl<0UL,_const_Atari::ST::Video_*,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ;
  }
  __assert_fail("!non_const_this->flush_concurrency_check_.test_and_set()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Atari/ST/../../../ClockReceiver/JustInTime.hpp"
                ,0x8d,
                "auto JustInTimeActor<Atari::ST::Video>::operator->() const [T = Atari::ST::Video, LocalTimeScale = HalfCycles, multiplier = 1, divider = 1]"
               );
}

Assistant:

[[nodiscard]] forceinline auto operator -> () const {
			auto non_const_this = const_cast<JustInTimeActor<T, LocalTimeScale, multiplier, divider> *>(this);
#ifndef NDEBUG
			assert(!non_const_this->flush_concurrency_check_.test_and_set());
#endif
			non_const_this->flush();
#ifndef NDEBUG
			non_const_this->flush_concurrency_check_.clear();
#endif
			return std::unique_ptr<const T, SequencePointAwareDeleter>(&object_, SequencePointAwareDeleter(non_const_this));
		}